

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.h
# Opt level: O0

void __thiscall capnp::compiler::BrandedDecl::BrandedDecl(BrandedDecl *this)

{
  BrandedDecl *this_local;
  
  kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
  OneOf(&this->body);
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::Own(&this->brand);
  Expression::Reader::Reader(&this->source);
  return;
}

Assistant:

static BrandedDecl implicitMethodParam(uint index) {
    // Get a BrandedDecl referring to an implicit method parameter.
    // (As a hack, we internally represent this as a ResolvedParameter. Sorry.)
    return BrandedDecl(Resolver::ResolvedParameter { 0, index }, Expression::Reader());
  }